

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

bool __thiscall Clasp::ImpliedList::assign(ImpliedList *this,Solver *s)

{
  pointer pIVar1;
  undefined8 uVar2;
  uint uVar3;
  size_type sVar4;
  ulong uVar5;
  long lVar6;
  AnteInfo *a;
  uint uVar7;
  iterator first;
  bool bVar8;
  
  bVar8 = (s->conflict_).ebo_.size == 0;
  uVar7 = (s->levels_).super_type.ebo_.size;
  pIVar1 = (this->lits).ebo_.buf;
  uVar5 = (ulong)this->front;
  a = &pIVar1[uVar5].ante;
  first = pIVar1 + uVar5;
  for (lVar6 = (ulong)(this->lits).ebo_.size * 0x18 + uVar5 * -0x18; lVar6 != 0;
      lVar6 = lVar6 + -0x18) {
    uVar3 = *(uint *)((long)(a + -1) + 0xc);
    if (uVar3 <= uVar7) {
      if (bVar8 == false) {
        bVar8 = false;
      }
      else {
        bVar8 = Solver::force(s,(Literal *)((long)(a + -1) + 8),(Antecedent *)a,
                              (a->super_pair<Clasp::Antecedent,_unsigned_int>).second);
        uVar3 = *(uint *)((long)(a + -1) + 0xc);
      }
      if ((uVar3 < uVar7) || ((a->super_pair<Clasp::Antecedent,_unsigned_int>).first.data_ == 0)) {
        uVar2 = *(undefined8 *)((long)(a + -1) + 8);
        first->lit = (Literal)(int)uVar2;
        first->level = (int)((ulong)uVar2 >> 0x20);
        (first->ante).super_pair<Clasp::Antecedent,_unsigned_int>.first.data_ =
             (a->super_pair<Clasp::Antecedent,_unsigned_int>).first.data_;
        (first->ante).super_pair<Clasp::Antecedent,_unsigned_int>.second =
             (a->super_pair<Clasp::Antecedent,_unsigned_int>).second;
        first = first + 1;
      }
    }
    a = (AnteInfo *)((long)(a + 1) + 8);
  }
  bk_lib::pod_vector<Clasp::ImpliedLiteral,_std::allocator<Clasp::ImpliedLiteral>_>::erase
            (&this->lits,first,(this->lits).ebo_.buf + (this->lits).ebo_.size);
  sVar4 = (this->lits).ebo_.size;
  if (sVar4 == 0) {
    uVar7 = 0;
  }
  this->level = uVar7;
  if ((s->levels_).root < uVar7) {
    sVar4 = this->front;
  }
  this->front = sVar4;
  return bVar8;
}

Assistant:

bool ImpliedList::assign(Solver& s) {
	assert(front <= lits.size());
	bool ok             = !s.hasConflict();
	const uint32 DL     = s.decisionLevel();
	VecType::iterator j = lits.begin() + front;
	for (VecType::iterator it = j, end = lits.end(); it != end; ++it) {
		if(it->level <= DL) {
			ok = ok && s.force(it->lit, it->ante.ante(), it->ante.data());
			if (it->level < DL || it->ante.ante().isNull()) { *j++ = *it; }
		}
	}
	lits.erase(j, lits.end());
	level = DL * uint32(!lits.empty());
	front = level > s.rootLevel() ? front  : sizeVec(lits);
	return ok;
}